

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O3

void com_pager(int msgnum)

{
  int iVar1;
  qtmsg *qt_msg;
  qtmsg *qt_msg_00;
  
  iVar1 = qt_list_0->msgnum;
  qt_msg_00 = qt_list_0;
  while( true ) {
    if (iVar1 < 1) {
      warning("com_pager: message %d not found.");
      return;
    }
    if (iVar1 == msgnum) break;
    iVar1 = qt_msg_00[1].msgnum;
    qt_msg_00 = qt_msg_00 + 1;
  }
  dlb_fseek(msg_file,qt_msg_00->offset,0);
  if (qt_msg_00->delivery == 'p') {
    deliver_by_pline(qt_msg_00);
    return;
  }
  deliver_by_window(qt_msg_00);
  return;
}

Assistant:

void com_pager(int msgnum)
{
	struct qtmsg *qt_msg;

	if (!(qt_msg = msg_in(qt_list.common, msgnum))) {
		warning("com_pager: message %d not found.", msgnum);
		return;
	}

	dlb_fseek(msg_file, qt_msg->offset, SEEK_SET);
	if (qt_msg->delivery == 'p') deliver_by_pline(qt_msg);
	else deliver_by_window(qt_msg);
	return;
}